

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void __thiscall
QMakeEvaluator::visitProFunctionDef(QMakeEvaluator *this,ushort tok,ProKey *name,ushort *tokPtr)

{
  long lVar1;
  ProFunctionDef *in_RCX;
  long in_RDI;
  long in_FS_OFFSET;
  QHash<ProKey,_ProFunctionDef> *hash;
  ProFile *pro;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pro = *(ProFile **)(in_RDI + 0x10);
  ProFile::tokPtr((ProFile *)0x2f5e37);
  ProFunctionDef::ProFunctionDef(in_RCX,pro,0);
  QHash<ProKey,_ProFunctionDef>::insert
            ((QHash<ProKey,_ProFunctionDef> *)in_RCX,(ProKey *)pro,(ProFunctionDef *)0x2f5e6e);
  ProFunctionDef::~ProFunctionDef(in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::visitProFunctionDef(
        ushort tok, const ProKey &name, const ushort *tokPtr)
{
    QHash<ProKey, ProFunctionDef> *hash =
            (tok == TokTestDef
             ? &m_functionDefs.testFunctions
             : &m_functionDefs.replaceFunctions);
    hash->insert(name, ProFunctionDef(m_current.pro, tokPtr - m_current.pro->tokPtr()));
}